

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LessEvaluationTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  long *plVar7;
  ulong *puVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Variable x;
  Variable y;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  Expression local_178;
  long lStack_160;
  Expression local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  Variable local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Variable local_e8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_1b8 = (undefined8 *)0x0;
  local_120._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
  local_120.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_120.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_120.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_198,(double *)&local_1b8);
  local_1b8 = (undefined8 *)0x0;
  local_e8._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
  local_e8.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_e8.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_e8.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_198,(double *)&local_1b8);
  (local_120.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_e8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_158,&local_120,&local_e8);
  (**(local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_120.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_108,vsnprintf,0x148,"%f");
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x10a010);
  p_Var1 = &local_178.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  plVar7 = plVar4 + 2;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar4 ==
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)plVar7) {
    local_178.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
    lStack_160 = plVar4[3];
    local_178._vptr_Expression = (_func_int **)p_Var1;
  }
  else {
    local_178.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
    local_178._vptr_Expression = (_func_int **)*plVar4;
  }
  local_178.m_baseExpressionPtr.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
  paVar2 = &local_198.field_2;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198.field_2._8_8_ = plVar4[3];
    local_198._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_198._M_string_length = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  (**((local_e8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_140,vsnprintf,0x148,"%f");
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    uVar10 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_140._M_string_length + local_198._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      uVar10 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_140._M_string_length + local_198._M_string_length) goto LAB_0010656c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_140,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
  }
  else {
LAB_0010656c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_140._M_dataplus._M_p);
  }
  local_1b8 = &local_1a8;
  puVar9 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar9) {
    local_1a8 = *puVar9;
    uStack_1a0 = puVar5[3];
  }
  else {
    local_1a8 = *puVar9;
    local_1b8 = (undefined8 *)*puVar5;
  }
  local_1b0 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50,local_48);
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_001070ba;
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  paVar3 = &local_140.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar3) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178._vptr_Expression != p_Var1) {
    operator_delete(local_178._vptr_Expression);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
      &local_108.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_));
  }
  local_158._vptr_Expression = (_func_int **)&PTR_variables_0010ccd8;
  if (local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_158,&local_e8,&local_120);
  (**(local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_e8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_108,vsnprintf,0x148,"%f");
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x10a010);
  plVar4 = puVar5 + 2;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar5 ==
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)plVar4) {
    local_178.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
    lStack_160 = puVar5[3];
    local_178._vptr_Expression = (_func_int **)p_Var1;
  }
  else {
    local_178.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
    local_178._vptr_Expression = (_func_int **)*puVar5;
  }
  local_178.m_baseExpressionPtr.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  puVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198.field_2._8_8_ = puVar5[3];
    local_198._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_198._M_string_length = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  (**((local_120.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_140,vsnprintf,0x148,"%f");
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    uVar10 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_140._M_string_length + local_198._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      uVar10 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_140._M_string_length + local_198._M_string_length) goto LAB_0010686c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_140,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
  }
  else {
LAB_0010686c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_140._M_dataplus._M_p);
  }
  puVar9 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar9) {
    local_1a8 = *puVar9;
    uStack_1a0 = puVar5[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar9;
    local_1b8 = (undefined8 *)*puVar5;
  }
  local_1b0 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((extraout_XMM0_Qa_00 != 1.0) || (NAN(extraout_XMM0_Qa_00))) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_70,local_68);
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_001070ba;
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  p_Var1 = &local_178.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar3) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178._vptr_Expression != p_Var1) {
    operator_delete(local_178._vptr_Expression);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
      &local_108.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_));
  }
  local_158._vptr_Expression = (_func_int **)&PTR_variables_0010ccd8;
  if (local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  (local_e8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_158,&local_120,&local_e8);
  (**(local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_120.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_108,vsnprintf,0x148,"%f");
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x10a010);
  plVar4 = puVar5 + 2;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar5 ==
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)plVar4) {
    local_178.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
    lStack_160 = puVar5[3];
    local_178._vptr_Expression = (_func_int **)p_Var1;
  }
  else {
    local_178.m_baseExpressionPtr.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
    local_178._vptr_Expression = (_func_int **)*puVar5;
  }
  local_178.m_baseExpressionPtr.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  puVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198.field_2._8_8_ = puVar5[3];
    local_198._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_198._M_string_length = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  (**((local_e8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_140,vsnprintf,0x148,"%f");
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    uVar10 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_140._M_string_length + local_198._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      uVar10 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_140._M_string_length + local_198._M_string_length) goto LAB_00106b73;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_140,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
  }
  else {
LAB_00106b73:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_140._M_dataplus._M_p);
  }
  puVar9 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar9) {
    local_1a8 = *puVar9;
    uStack_1a0 = puVar5[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar9;
    local_1b8 = (undefined8 *)*puVar5;
  }
  local_1b0 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((extraout_XMM0_Qa_01 != 0.0) || (NAN(extraout_XMM0_Qa_01))) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_90,local_88);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178._vptr_Expression !=
        &local_178.m_baseExpressionPtr.
         super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete(local_178._vptr_Expression);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
        &local_108.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_));
    }
    local_158._vptr_Expression = (_func_int **)&PTR_variables_0010ccd8;
    if (local_158.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.m_baseExpressionPtr.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_108._M_dataplus._M_p._0_4_ = 4;
    Kandinsky::operator<<Kandinsky::Variable,_int,_nullptr>(&local_178,&local_120,(int *)&local_108)
    ;
    (**(local_178.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_BaseExpression)();
    (**((local_120.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_BaseExpression)._vptr_BaseExpression)();
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_198,vsnprintf,0x148,"%f");
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x10a010);
    puVar9 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar9) {
      local_1a8 = *puVar9;
      uStack_1a0 = puVar5[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = *puVar9;
      local_1b8 = (undefined8 *)*puVar5;
    }
    local_1b0 = puVar5[1];
    *puVar5 = puVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_a0 = *plVar7;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar7;
      local_b0 = (long *)*plVar4;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((extraout_XMM0_Qa_02 != 1.0) || (NAN(extraout_XMM0_Qa_02))) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_b0,local_a8);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_178._vptr_Expression = (_func_int **)&PTR_variables_0010ccd8;
      if (local_178.m_baseExpressionPtr.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.m_baseExpressionPtr.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_108._M_dataplus._M_p._0_4_ = 4;
      Kandinsky::operator<<int,_Kandinsky::Variable,_nullptr>
                (&local_178,(int *)&local_108,&local_120);
      (**(local_178.m_baseExpressionPtr.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_BaseExpression)();
      (**((local_120.m_variableExpressionPtr.
           super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_BaseExpression)._vptr_BaseExpression)();
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_198,vsnprintf,0x148,"%f");
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x10a024)
      ;
      puVar9 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar9) {
        local_1a8 = *puVar9;
        uStack_1a0 = puVar5[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *puVar9;
        local_1b8 = (undefined8 *)*puVar5;
      }
      local_1b0 = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_c0 = *plVar7;
        lStack_b8 = plVar4[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar7;
        local_d0 = (long *)*plVar4;
      }
      local_c8 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((extraout_XMM0_Qa_03 == 0.0) && (!NAN(extraout_XMM0_Qa_03))) {
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        local_178._vptr_Expression = (_func_int **)&PTR_variables_0010ccd8;
        if (local_178.m_baseExpressionPtr.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.m_baseExpressionPtr.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_e8._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
        if (local_e8.m_variableExpressionPtr.
            super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.m_variableExpressionPtr.
                     super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_120._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
        if (local_120.m_variableExpressionPtr.
            super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_120.m_variableExpressionPtr.
                     super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        return 0;
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_d0,local_c8);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
LAB_001070ba:
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x < y).evaluate() == 0, "(" + std::to_string(x.evaluate()) + " < " + std::to_string(y.evaluate()) + ") != 0");
    assertOrExit((y < x).evaluate() == 1, "(" + std::to_string(y.evaluate()) + " < " + std::to_string(x.evaluate()) + ") != 1");
    y.setValue(3);
    assertOrExit((x < y).evaluate() == 0, "(" + std::to_string(x.evaluate()) + " < " + std::to_string(y.evaluate()) + ") != 0");
    assertOrExit((x < 4).evaluate() == 1, "(" + std::to_string(x.evaluate()) + " < 4) != 1");
    assertOrExit((4 < x).evaluate() == 0, "(4 < " + std::to_string(x.evaluate()) + ") != 0");
    return 0;
}